

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManComputeCutLo(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  void *Entry;
  int i;
  
  p_00 = Vec_PtrAlloc(100);
  for (i = 0; i < p->vCis->nSize; i = i + 1) {
    Entry = Vec_PtrEntry(p->vCis,i);
    Vec_PtrPush(p_00,Entry);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLo( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_PtrPush( vMinCut, pObj );
    return vMinCut;
}